

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_utils.h
# Opt level: O2

void free_cstr_arr(char **arr,size_t sz)

{
  size_t i;
  size_t sVar1;
  
  if (arr != (char **)0x0) {
    if (0 < (int)sz) {
      for (sVar1 = 0; sz != sVar1; sVar1 = sVar1 + 1) {
        free(arr[sVar1]);
      }
    }
    free(arr);
    return;
  }
  return;
}

Assistant:

inline void free_cstr_arr(char **arr, size_t sz) {
    if (arr == NULL)
        return;

    if ((int)sz > 0)
        for (size_t i = 0; i < sz; i++)
            free(arr[i]);

    free(arr);
}